

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O0

void * rw::d3d::createNativeRaster(void *object,int32 offset,int32 param_3)

{
  undefined8 *puVar1;
  D3dRaster *raster;
  int32 param_2_local;
  int32 offset_local;
  void *object_local;
  
  puVar1 = (undefined8 *)((long)object + (long)offset);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  *(undefined4 *)(puVar1 + 3) = 0;
  *(undefined1 *)(puVar1 + 4) = 0;
  *(undefined1 *)((long)puVar1 + 0x21) = 0;
  return object;
}

Assistant:

static void*
createNativeRaster(void *object, int32 offset, int32)
{
	D3dRaster *raster = PLUGINOFFSET(D3dRaster, object, offset);
	raster->texture = nil;
	raster->palette = nil;
	raster->lockedSurf = nil;
	raster->format = 0;
	raster->hasAlpha = 0;
	raster->customFormat = 0;
	return object;
}